

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.hpp
# Opt level: O2

shared_ptr<helics::CommFactory::CommBuilder>
helics::CommFactory::addCommType<helics::ipc::IpcComms>(string_view commTypeName,int code)

{
  int in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2> *__r;
  string_view name;
  shared_ptr<helics::CommFactory::CommBuilder> sVar1;
  shared_ptr<helics::CommFactory::CommTypeBuilder<helics::ipc::IpcComms>_> bld;
  __shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  name._M_str._4_4_ = in_register_00000014;
  name._M_str._0_4_ = code;
  name._M_len = commTypeName._M_str;
  __r = (__shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2> *)
        commTypeName._M_len;
  std::make_shared<helics::CommFactory::CommTypeBuilder<helics::ipc::IpcComms>>();
  std::
  static_pointer_cast<helics::CommFactory::CommBuilder,helics::CommFactory::CommTypeBuilder<helics::ipc::IpcComms>>
            ((shared_ptr<helics::CommFactory::CommTypeBuilder<helics::ipc::IpcComms>_> *)__r);
  std::__shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,__r);
  defineCommBuilder((shared_ptr<helics::CommFactory::CommBuilder> *)&_Stack_48,name,in_ECX);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_48._M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  sVar1.super___shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__r;
  return (shared_ptr<helics::CommFactory::CommBuilder>)
         sVar1.super___shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CommBuilder> addCommType(std::string_view commTypeName, int code)
    {
        auto bld = std::make_shared<CommTypeBuilder<CommTYPE>>();
        std::shared_ptr<CommBuilder> cbld = std::static_pointer_cast<CommBuilder>(bld);
        defineCommBuilder(cbld, commTypeName, code);
        return cbld;
    }